

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O1

double __thiscall
Problem_CGBG_FF::ComputeHouseProbability
          (Problem_CGBG_FF *this,Index houseI,Scope *tupleOfAgents,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *types)

{
  bool bVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined1 in_XMM3 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> oVec_hI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  double local_20;
  
  FilterObservationsForHouse(&local_38,this,houseI,tupleOfAgents,types);
  if (this->_m_nrFireLevels == 0) {
    dVar7 = 0.0;
  }
  else {
    uVar5 = 0;
    dVar7 = 0.0;
    do {
      dVar6 = 1.0;
      if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        dVar6 = 1.0;
        uVar3 = 0;
        uVar4 = 1;
        do {
          local_20 = dVar6;
          dVar6 = FLObservationProb(this,(Index)uVar5,
                                    local_38.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar3]);
          dVar6 = local_20 * dVar6;
          bVar1 = uVar4 < (ulong)((long)local_38.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_38.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2);
          uVar3 = uVar4;
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (bVar1);
      }
      auVar2 = vcvtusi2sd_avx512f(in_XMM3,this->_m_nrFireLevels);
      dVar7 = dVar7 + dVar6 * (1.0 / auVar2._0_8_);
      uVar5 = (ulong)((Index)uVar5 + 1);
    } while (uVar5 < this->_m_nrFireLevels);
  }
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return dVar7;
}

Assistant:

double Problem_CGBG_FF::ComputeHouseProbability(Index houseI,  
        const Scope& tupleOfAgents,
        const vector<Index>& types
        //const vector<Problem_CGBG_FF::observation_t>& oVec_hI
    ) const
{
#if DEBUGPROBS
    cout << "\tComputeHouseProbability for house "<<houseI
         << " tupleOfAgents=" << tupleOfAgents 
         << " types=" << PrintTools::SoftPrintVector(types)<<endl;
#endif
    vector<Problem_CGBG_FF::observation_t> oVec_hI = 
        FilterObservationsForHouse(houseI, tupleOfAgents, types);
#if DEBUGPROBS
    cout << "\tThe observation vector for this house is " << 
        PrintTools::SoftPrintVector(oVec_hI)<<endl;
#endif

    double p = 0.0;
    for(Index fl=0; fl < _m_nrFireLevels; fl++)
    {
        double p_oVec_fl = Likelihood(houseI, oVec_hI, fl) * Prior(houseI, fl);
#if DEBUGPROBS
        cout << "\tP(oVec, FL="<<fl<<") = " << p_oVec_fl << endl;
#endif
        p += p_oVec_fl;
    }
#if DEBUGPROBS
    cout << "P(oVec)="<< p << endl;
#endif
    return p;
}